

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP4Reader::DoClose(BP4Reader *this,int transportIndex)

{
  int iVar1;
  undefined4 in_register_00000034;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  ScopedTimer __var2846;
  string local_68;
  string local_48;
  string local_28;
  
  if (DoClose(int)::__var846 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var846,
                                CONCAT44(in_register_00000034,transportIndex));
    if (iVar1 != 0) {
      DoClose::__var846 = (void *)ps_timer_create_("BP4Reader::Close");
      __cxa_guard_release(&DoClose(int)::__var846);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2846,DoClose::__var846);
  std::__cxx11::string::string((string *)&local_28,"Engine",&local_71);
  std::__cxx11::string::string((string *)&local_48,"BP4Reader",&local_72);
  std::__cxx11::string::string((string *)&local_68,"Close",&local_73);
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_28,&local_48,&local_68,&(this->super_Engine).m_Name,0,iVar1,5,this->m_Verbosity
              ,INFO);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  PerformGets(this);
  Engine::RemoveCreatedVars(&this->super_Engine);
  transportman::TransportMan::CloseFiles(&this->m_DataFileManager,-1);
  transportman::TransportMan::CloseFiles(&this->m_MDFileManager,-1);
  transportman::TransportMan::CloseFiles(&this->m_MDIndexFileManager,-1);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2846);
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}